

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Materials.cpp
# Opt level: O3

SP __thiscall pbrt::SemanticParser::createMaterial_disney(SemanticParser *this,SP *in)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ParamSet *pPVar2;
  element_type *peVar3;
  bool bVar4;
  long *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  float fVar6;
  SP SVar7;
  string local_58;
  element_type *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  std::__shared_ptr<pbrt::DisneyMaterial,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<pbrt::DisneyMaterial>,std::__cxx11::string&>
            ((__shared_ptr<pbrt::DisneyMaterial,(__gnu_cxx::_Lock_policy)2> *)&local_38,
             (allocator<pbrt::DisneyMaterial> *)&local_58,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(*in_RDX + 0x60));
  peVar3 = local_38;
  pPVar2 = (ParamSet *)*in_RDX;
  paVar1 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"color","");
  syntactic::ParamSet::getParam3f
            (pPVar2,(float *)((long)&(peVar3->sampler).
                                     super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_ptr + 4),&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pPVar2 = (ParamSet *)*in_RDX;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"anisotropic","");
  fVar6 = syntactic::ParamSet::getParam1f(pPVar2,&local_58,0.0);
  *(float *)&(local_38->film).super___shared_ptr<pbrt::Film,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi = fVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pPVar2 = (ParamSet *)*in_RDX;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"clearcoat","");
  fVar6 = syntactic::ParamSet::getParam1f(pPVar2,&local_58,0.0);
  *(float *)((long)&(local_38->film).super___shared_ptr<pbrt::Film,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi + 4) = fVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pPVar2 = (ParamSet *)*in_RDX;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"clearcoatgloss","");
  fVar6 = syntactic::ParamSet::getParam1f(pPVar2,&local_58,1.0);
  *(float *)&(local_38->sampler).super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr = fVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pPVar2 = (ParamSet *)*in_RDX;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"difftrans","");
  fVar6 = syntactic::ParamSet::getParam1f(pPVar2,&local_58,1.35);
  *(float *)&(local_38->integrator).super___shared_ptr<pbrt::Integrator,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr = fVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pPVar2 = (ParamSet *)*in_RDX;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"eta","");
  fVar6 = syntactic::ParamSet::getParam1f(pPVar2,&local_58,1.2);
  *(float *)((long)&(local_38->integrator).
                    super___shared_ptr<pbrt::Integrator,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) =
       fVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pPVar2 = (ParamSet *)*in_RDX;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"flatness","");
  fVar6 = syntactic::ParamSet::getParam1f(pPVar2,&local_58,0.2);
  *(float *)&(local_38->integrator).super___shared_ptr<pbrt::Integrator,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi = fVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pPVar2 = (ParamSet *)*in_RDX;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"metallic","");
  fVar6 = syntactic::ParamSet::getParam1f(pPVar2,&local_58,0.0);
  *(float *)((long)&(local_38->integrator).
                    super___shared_ptr<pbrt::Integrator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi + 4) = fVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pPVar2 = (ParamSet *)*in_RDX;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"roughness","");
  fVar6 = syntactic::ParamSet::getParam1f(pPVar2,&local_58,0.9);
  *(float *)&(local_38->pixelFilter).
             super___shared_ptr<pbrt::PixelFilter,_(__gnu_cxx::_Lock_policy)2>._M_ptr = fVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pPVar2 = (ParamSet *)*in_RDX;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"sheen","");
  fVar6 = syntactic::ParamSet::getParam1f(pPVar2,&local_58,0.3);
  *(float *)((long)&(local_38->pixelFilter).
                    super___shared_ptr<pbrt::PixelFilter,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) =
       fVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pPVar2 = (ParamSet *)*in_RDX;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"sheentint","");
  fVar6 = syntactic::ParamSet::getParam1f(pPVar2,&local_58,0.68);
  *(float *)&(local_38->pixelFilter).
             super___shared_ptr<pbrt::PixelFilter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       fVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pPVar2 = (ParamSet *)*in_RDX;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"spectrans","");
  fVar6 = syntactic::ParamSet::getParam1f(pPVar2,&local_58,0.0);
  *(float *)((long)&(local_38->pixelFilter).
                    super___shared_ptr<pbrt::PixelFilter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi + 4) = fVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pPVar2 = (ParamSet *)*in_RDX;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"speculartint","");
  fVar6 = syntactic::ParamSet::getParam1f(pPVar2,&local_58,0.0);
  *(float *)&(local_38->world).super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       fVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pPVar2 = (ParamSet *)*in_RDX;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"thin","");
  bVar4 = syntactic::ParamSet::getParamBool(pPVar2,&local_58,true);
  *(bool *)((long)&(local_38->world).super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr + 4) = bVar4;
  _Var5._M_pi = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    _Var5._M_pi = extraout_RDX_00;
  }
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_38;
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_30;
  SVar7.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  SVar7.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (SP)SVar7.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Material::SP SemanticParser::createMaterial_disney(pbrt::syntactic::Material::SP in)
  {
    DisneyMaterial::SP mat = std::make_shared<DisneyMaterial>(in->name);

    in->getParam3f(&mat->color.x,"color");
    mat->anisotropic    = in->getParam1f("anisotropic",    0.f );
    mat->clearCoat      = in->getParam1f("clearcoat",      0.f );
    mat->clearCoatGloss = in->getParam1f("clearcoatgloss", 1.f );
    mat->diffTrans      = in->getParam1f("difftrans",      1.35f );
    mat->eta            = in->getParam1f("eta",            1.2f );
    mat->flatness       = in->getParam1f("flatness",       0.2f );
    mat->metallic       = in->getParam1f("metallic",       0.f );
    mat->roughness      = in->getParam1f("roughness",      0.9f );
    mat->sheen          = in->getParam1f("sheen",          0.3f );
    mat->sheenTint      = in->getParam1f("sheentint",      0.68f );
    mat->specTrans      = in->getParam1f("spectrans",      0.f );
    mat->specularTint   = in->getParam1f("speculartint",   0.f );
    mat->thin           = in->getParamBool("thin",           true);
    return mat;
  }